

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StringBuilder.h
# Opt level: O1

char16 * __thiscall
Js::StringBuilder<Memory::ArenaAllocator>::Detach(StringBuilder<Memory::ArenaAllocator> *this)

{
  Data *pDVar1;
  
  Append(this,L'\0');
  if (this->secondChunk != (Data *)0x0) {
    UnChain(this);
  }
  this->count = this->count - 1;
  pDVar1 = this->firstChunk;
  this->lastChunk = (Data *)0x0;
  this->firstChunk = (Data *)0x0;
  return (char16 *)pDVar1;
}

Assistant:

char16* Detach()
        {
            // NULL terminate the string
            Append(_u('\0'));

            // if there is a chain we need to account for that also, so that the new buffer will have the NULL at the end.
            if (this->IsChained())
            {
                this->UnChain();
            }
            // Now decrement the count to adjust according to number of chars
            this->count--;

            char16* result = this->firstChunk->u.single.buffer;
            this->firstChunk = this->lastChunk = NULL;
            return result;
        }